

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseChunk(xmlParserCtxtPtr ctxt,char *chunk,int size,int terminate)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlParserInputBufferPtr pxVar4;
  xmlCharEncodingHandlerPtr pxVar5;
  ulong uVar6;
  endDocumentSAXFunc p_Var7;
  xmlGenericErrorFunc p_Var8;
  bool bVar9;
  uint uVar10;
  bool bVar11;
  int iVar12;
  xmlParserInputState xVar13;
  size_t sVar14;
  size_t sVar15;
  xmlParserInputPtr pxVar16;
  size_t sVar17;
  void *pvVar18;
  xmlChar *pxVar19;
  xmlGenericErrorFunc *pp_Var20;
  void **ppvVar21;
  uint uVar22;
  bool bVar23;
  uint local_50;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return 1;
  }
  if ((ctxt->errNo != 0) && (ctxt->disableSAX == 1)) {
    return ctxt->errNo;
  }
  if (ctxt->instate == XML_PARSER_EOF) {
    return -1;
  }
  if (ctxt->instate == XML_PARSER_START) {
    xmlDetectSAX2(ctxt);
  }
  if (terminate == 0 && (chunk != (char *)0x0 && 0 < size)) {
    bVar23 = chunk[(ulong)(uint)size - 1] == '\r';
    size = size - (uint)bVar23;
  }
  else {
    bVar23 = false;
  }
  sVar17 = 0;
  sVar15 = 0;
  do {
    if ((((size < 1) || (chunk == (char *)0x0)) ||
        (pxVar16 = ctxt->input, pxVar16 == (xmlParserInputPtr)0x0)) ||
       (pxVar16->buf == (xmlParserInputBufferPtr)0x0)) {
      if (ctxt->instate == XML_PARSER_EOF) {
LAB_001654f9:
        if ((ctxt->input != (xmlParserInputPtr)0x0) &&
           (pxVar4 = ctxt->input->buf, pxVar4 != (xmlParserInputBufferPtr)0x0)) {
          sVar17 = xmlBufUse(pxVar4->buffer);
        }
      }
      else {
        pxVar16 = ctxt->input;
        if ((pxVar16 != (xmlParserInputPtr)0x0) &&
           (pxVar4 = pxVar16->buf, pxVar4 != (xmlParserInputBufferPtr)0x0)) {
          if ((pxVar4->encoder != (xmlCharEncodingHandlerPtr)0x0) &&
             ((pxVar4->buffer != (xmlBufPtr)0x0 && (pxVar4->raw != (xmlBufPtr)0x0)))) {
            sVar14 = xmlBufGetInputBase(pxVar4->buffer,pxVar16);
            pxVar2 = ctxt->input->cur;
            pxVar3 = ctxt->input->base;
            iVar12 = xmlCharEncInput(pxVar4,terminate);
            xmlBufSetInputBaseCur(pxVar4->buffer,ctxt->input,sVar14,(long)pxVar2 - (long)pxVar3);
            if (iVar12 < 0) {
              pp_Var20 = __xmlGenericError();
              p_Var8 = *pp_Var20;
              ppvVar21 = __xmlGenericErrorContext();
              (*p_Var8)(*ppvVar21,"xmlParseChunk: encoder error\n");
              xmlHaltParser(ctxt);
              return 0x51;
            }
          }
          goto LAB_001654f9;
        }
      }
      iVar12 = terminate;
      local_50 = 0;
      bVar11 = true;
      if ((sVar17 == 0 || sVar15 == 0) || (10000000 < sVar17 || terminate != 0)) goto LAB_001655d9;
      pxVar2 = ctxt->input->base;
      uVar22 = (int)sVar17 - (int)sVar15;
      bVar11 = true;
      if (((int)uVar22 < 0 || pxVar2 == (xmlChar *)0x0) ||
         ((((xVar13 = ctxt->instate, xVar13 != XML_PARSER_START_TAG &&
            (xVar13 != XML_PARSER_END_TAG)) && (iVar1 = ctxt->progressive, iVar1 != 2)) &&
          (((xVar13 != XML_PARSER_CDATA_SECTION && (iVar1 != 5)) &&
           (local_50 = 0, xVar13 != XML_PARSER_DTD && iVar1 != 3)))))) goto LAB_001655d9;
      pvVar18 = memchr(pxVar2 + sVar15,0x3e,(ulong)(uVar22 & 0x7fffffff));
      bVar9 = true;
      local_50 = 0;
      uVar22 = size;
      uVar10 = 0;
      bVar11 = true;
      if (pvVar18 != (void *)0x0) goto LAB_001655d9;
    }
    else {
      if (ctxt->instate == XML_PARSER_EOF) goto LAB_001654f9;
      sVar14 = xmlBufGetInputBase(pxVar16->buf->buffer,pxVar16);
      pxVar16 = ctxt->input;
      pxVar2 = pxVar16->cur;
      pxVar3 = pxVar16->base;
      sVar15 = xmlBufUse(pxVar16->buf->buffer);
      pxVar16 = ctxt->input;
      if (((ctxt->instate == XML_PARSER_START) && (pxVar16->buf != (xmlParserInputBufferPtr)0x0)) &&
         (pxVar5 = pxVar16->buf->encoder, pxVar5 != (xmlCharEncodingHandlerPtr)0x0)) {
        pxVar19 = xmlStrcasestr((xmlChar *)pxVar5->name,(xmlChar *)"UTF-16");
        uVar22 = 0x5a;
        if (pxVar19 == (xmlChar *)0x0) {
          pxVar19 = xmlStrcasestr((xmlChar *)ctxt->input->buf->encoder->name,(xmlChar *)"UTF16");
          uVar22 = 0x5a;
          if (pxVar19 == (xmlChar *)0x0) {
            pxVar19 = xmlStrcasestr((xmlChar *)ctxt->input->buf->encoder->name,"UCS-4");
            if (pxVar19 == (xmlChar *)0x0) {
              pxVar19 = xmlStrcasestr((xmlChar *)ctxt->input->buf->encoder->name,(xmlChar *)"UCS4");
              uVar22 = 0x2d;
              if (pxVar19 == (xmlChar *)0x0) goto LAB_00165703;
            }
            uVar22 = 0xb4;
          }
        }
LAB_00165703:
        pxVar16 = ctxt->input;
        uVar6 = pxVar16->buf->rawconsumed;
        iVar12 = (int)uVar6;
        if (uVar22 <= uVar6) {
          iVar12 = 0;
        }
        uVar22 = uVar22 - iVar12;
        local_50 = size - uVar22;
        if ((uint)size < uVar22) {
          local_50 = 0;
          uVar22 = size;
        }
      }
      else {
        local_50 = 0;
        uVar22 = size;
      }
      size = uVar22;
      iVar12 = xmlParserInputBufferPush(pxVar16->buf,size,chunk);
      xmlBufSetInputBaseCur(ctxt->input->buf->buffer,ctxt->input,sVar14,(long)pxVar2 - (long)pxVar3)
      ;
      if (iVar12 < 0) {
        ctxt->errNo = -1;
        xmlHaltParser(ctxt);
        return -1;
      }
      if (local_50 == 0) goto LAB_001654f9;
      iVar12 = 0;
      bVar11 = false;
LAB_001655d9:
      bVar9 = bVar11;
      xmlParseTryOrFinish(ctxt,iVar12);
      uVar22 = size;
      uVar10 = local_50;
    }
    size = uVar10;
    if (ctxt->instate == XML_PARSER_EOF) goto LAB_0016583c;
    pxVar16 = ctxt->input;
    if (((pxVar16 != (xmlParserInputPtr)0x0) &&
        ((10000000 < (long)pxVar16->end - (long)pxVar16->cur ||
         (10000000 < (long)pxVar16->cur - (long)pxVar16->base)))) &&
       ((ctxt->options & 0x80000) == 0)) {
      xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"Huge input lookup");
      xmlHaltParser(ctxt);
    }
    if ((ctxt->errNo != 0) && (ctxt->disableSAX == 1)) {
      return ctxt->errNo;
    }
    if (bVar9) {
      if (((bVar23) && (pxVar16 = ctxt->input, pxVar16 != (xmlParserInputPtr)0x0)) &&
         (pxVar16->buf != (xmlParserInputBufferPtr)0x0)) {
        sVar15 = xmlBufGetInputBase(pxVar16->buf->buffer,pxVar16);
        pxVar16 = ctxt->input;
        pxVar2 = pxVar16->cur;
        pxVar3 = pxVar16->base;
        xmlParserInputBufferPush(pxVar16->buf,1,"\r");
        xmlBufSetInputBaseCur
                  (ctxt->input->buf->buffer,ctxt->input,sVar15,(long)pxVar2 - (long)pxVar3);
      }
      if (terminate != 0) {
        pxVar16 = ctxt->input;
        if (pxVar16 == (xmlParserInputPtr)0x0) {
          iVar12 = 0;
        }
        else if (pxVar16->buf == (xmlParserInputBufferPtr)0x0) {
          iVar12 = (*(int *)&pxVar16->base - *(int *)&pxVar16->cur) + pxVar16->length;
        }
        else {
          sVar15 = xmlBufUse(pxVar16->buf->buffer);
          iVar12 = ((int)sVar15 - *(int *)&ctxt->input->cur) + *(int *)&ctxt->input->base;
        }
        xVar13 = ctxt->instate;
        if ((xVar13 != XML_PARSER_EOF) && (xVar13 != XML_PARSER_EPILOG)) {
          xmlFatalErr(ctxt,XML_ERR_DOCUMENT_END,(char *)0x0);
          xVar13 = ctxt->instate;
        }
        if ((xVar13 == XML_PARSER_EPILOG) && (0 < iVar12)) {
          xmlFatalErr(ctxt,XML_ERR_DOCUMENT_END,(char *)0x0);
          xVar13 = ctxt->instate;
        }
        if (((xVar13 != XML_PARSER_EOF) && (ctxt->sax != (_xmlSAXHandler *)0x0)) &&
           (p_Var7 = ctxt->sax->endDocument, p_Var7 != (endDocumentSAXFunc)0x0)) {
          (*p_Var7)(ctxt->userData);
        }
        ctxt->instate = XML_PARSER_EOF;
      }
      iVar12 = 0;
      if (ctxt->wellFormed == 0) {
LAB_0016583c:
        iVar12 = ctxt->errNo;
      }
      return iVar12;
    }
    chunk = chunk + (int)uVar22;
  } while( true );
}

Assistant:

int
xmlParseChunk(xmlParserCtxtPtr ctxt, const char *chunk, int size,
              int terminate) {
    int end_in_lf = 0;
    int remain = 0;
    size_t old_avail = 0;
    size_t avail = 0;

    if (ctxt == NULL)
        return(XML_ERR_INTERNAL_ERROR);
    if ((ctxt->errNo != XML_ERR_OK) && (ctxt->disableSAX == 1))
        return(ctxt->errNo);
    if (ctxt->instate == XML_PARSER_EOF)
        return(-1);
    if (ctxt->instate == XML_PARSER_START)
        xmlDetectSAX2(ctxt);
    if ((size > 0) && (chunk != NULL) && (!terminate) &&
        (chunk[size - 1] == '\r')) {
	end_in_lf = 1;
	size--;
    }

xmldecl_done:

    if ((size > 0) && (chunk != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->instate != XML_PARSER_EOF))  {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer, ctxt->input);
	size_t cur = ctxt->input->cur - ctxt->input->base;
	int res;

        old_avail = xmlBufUse(ctxt->input->buf->buffer);
        /*
         * Specific handling if we autodetected an encoding, we should not
         * push more than the first line ... which depend on the encoding
         * And only push the rest once the final encoding was detected
         */
        if ((ctxt->instate == XML_PARSER_START) && (ctxt->input != NULL) &&
            (ctxt->input->buf != NULL) && (ctxt->input->buf->encoder != NULL)) {
            unsigned int len = 45;

            if ((xmlStrcasestr(BAD_CAST ctxt->input->buf->encoder->name,
                               BAD_CAST "UTF-16")) ||
                (xmlStrcasestr(BAD_CAST ctxt->input->buf->encoder->name,
                               BAD_CAST "UTF16")))
                len = 90;
            else if ((xmlStrcasestr(BAD_CAST ctxt->input->buf->encoder->name,
                                    BAD_CAST "UCS-4")) ||
                     (xmlStrcasestr(BAD_CAST ctxt->input->buf->encoder->name,
                                    BAD_CAST "UCS4")))
                len = 180;

            if (ctxt->input->buf->rawconsumed < len)
                len -= ctxt->input->buf->rawconsumed;

            /*
             * Change size for reading the initial declaration only
             * if size is greater than len. Otherwise, memmove in xmlBufferAdd
             * will blindly copy extra bytes from memory.
             */
            if ((unsigned int) size > len) {
                remain = size - len;
                size = len;
            } else {
                remain = 0;
            }
        }
	res = xmlParserInputBufferPush(ctxt->input->buf, size, chunk);
        xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input, base, cur);
	if (res < 0) {
	    ctxt->errNo = XML_PARSER_EOF;
	    xmlHaltParser(ctxt);
	    return (XML_PARSER_EOF);
	}
#ifdef DEBUG_PUSH
	xmlGenericError(xmlGenericErrorContext, "PP: pushed %d\n", size);
#endif

    } else if (ctxt->instate != XML_PARSER_EOF) {
	if ((ctxt->input != NULL) && ctxt->input->buf != NULL) {
	    xmlParserInputBufferPtr in = ctxt->input->buf;
	    if ((in->encoder != NULL) && (in->buffer != NULL) &&
		    (in->raw != NULL)) {
		int nbchars;
		size_t base = xmlBufGetInputBase(in->buffer, ctxt->input);
		size_t current = ctxt->input->cur - ctxt->input->base;

		nbchars = xmlCharEncInput(in, terminate);
		xmlBufSetInputBaseCur(in->buffer, ctxt->input, base, current);
		if (nbchars < 0) {
		    /* TODO 2.6.0 */
		    xmlGenericError(xmlGenericErrorContext,
				    "xmlParseChunk: encoder error\n");
                    xmlHaltParser(ctxt);
		    return(XML_ERR_INVALID_ENCODING);
		}
	    }
	}
    }
    if (remain != 0) {
        xmlParseTryOrFinish(ctxt, 0);
    } else {
        if ((ctxt->input != NULL) && (ctxt->input->buf != NULL))
            avail = xmlBufUse(ctxt->input->buf->buffer);
        /*
         * Depending on the current state it may not be such
         * a good idea to try parsing if there is nothing in the chunk
         * which would be worth doing a parser state transition and we
         * need to wait for more data
         */
        if ((terminate) || (avail > XML_MAX_TEXT_LENGTH) ||
            (old_avail == 0) || (avail == 0) ||
            (xmlParseCheckTransition(ctxt,
                       (const char *)&ctxt->input->base[old_avail],
                                     avail - old_avail)))
            xmlParseTryOrFinish(ctxt, terminate);
    }
    if (ctxt->instate == XML_PARSER_EOF)
        return(ctxt->errNo);

    if ((ctxt->input != NULL) &&
         (((ctxt->input->end - ctxt->input->cur) > XML_MAX_LOOKUP_LIMIT) ||
         ((ctxt->input->cur - ctxt->input->base) > XML_MAX_LOOKUP_LIMIT)) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
        xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR, "Huge input lookup");
        xmlHaltParser(ctxt);
    }
    if ((ctxt->errNo != XML_ERR_OK) && (ctxt->disableSAX == 1))
        return(ctxt->errNo);

    if (remain != 0) {
        chunk += size;
        size = remain;
        remain = 0;
        goto xmldecl_done;
    }
    if ((end_in_lf == 1) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL)) {
	size_t base = xmlBufGetInputBase(ctxt->input->buf->buffer,
					 ctxt->input);
	size_t current = ctxt->input->cur - ctxt->input->base;

	xmlParserInputBufferPush(ctxt->input->buf, 1, "\r");

	xmlBufSetInputBaseCur(ctxt->input->buf->buffer, ctxt->input,
			      base, current);
    }
    if (terminate) {
	/*
	 * Check for termination
	 */
	int cur_avail = 0;

	if (ctxt->input != NULL) {
	    if (ctxt->input->buf == NULL)
		cur_avail = ctxt->input->length -
			    (ctxt->input->cur - ctxt->input->base);
	    else
		cur_avail = xmlBufUse(ctxt->input->buf->buffer) -
			              (ctxt->input->cur - ctxt->input->base);
	}

	if ((ctxt->instate != XML_PARSER_EOF) &&
	    (ctxt->instate != XML_PARSER_EPILOG)) {
	    xmlFatalErr(ctxt, XML_ERR_DOCUMENT_END, NULL);
	}
	if ((ctxt->instate == XML_PARSER_EPILOG) && (cur_avail > 0)) {
	    xmlFatalErr(ctxt, XML_ERR_DOCUMENT_END, NULL);
	}
	if (ctxt->instate != XML_PARSER_EOF) {
	    if ((ctxt->sax) && (ctxt->sax->endDocument != NULL))
		ctxt->sax->endDocument(ctxt->userData);
	}
	ctxt->instate = XML_PARSER_EOF;
    }
    if (ctxt->wellFormed == 0)
	return((xmlParserErrors) ctxt->errNo);
    else
        return(0);
}